

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatVehicle.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatVehicle::operator==
          (GED_BasicGroundCombatVehicle *this,GED_BasicGroundCombatVehicle *Value)

{
  KBOOL KVar1;
  
  if (this->m_ui16EntityID != Value->m_ui16EntityID) {
    return false;
  }
  if ((((((this->m_i16Offsets[0] == Value->m_i16Offsets[0]) &&
         (this->m_i16Offsets[1] == Value->m_i16Offsets[1])) &&
        (this->m_i16Offsets[2] == Value->m_i16Offsets[2])) &&
       ((KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_EA,&Value->m_EA), !KVar1 &&
        (this->m_i8Ori[0] == Value->m_i8Ori[0])))) &&
      ((this->m_i8Ori[1] == Value->m_i8Ori[1] &&
       ((this->m_i8Ori[2] == Value->m_i8Ori[2] && (this->m_i8Spd == Value->m_i8Spd)))))) &&
     ((this->m_i8TrrtAz == Value->m_i8TrrtAz &&
      ((this->m_i8GnElv == Value->m_i8GnElv && (this->m_i8TrrtSlwRt == Value->m_i8TrrtSlwRt)))))) {
    return this->m_i8GnElvRt == Value->m_i8GnElvRt;
  }
  return false;
}

Assistant:

KBOOL GED_BasicGroundCombatVehicle::operator == ( const GED_BasicGroundCombatVehicle & Value ) const
{
    if( m_ui16EntityID      != Value.m_ui16EntityID )   return false;
    if( m_i16Offsets[0]     != Value.m_i16Offsets[0] )  return false;
    if( m_i16Offsets[1]     != Value.m_i16Offsets[1] )  return false;
    if( m_i16Offsets[2]     != Value.m_i16Offsets[2] )  return false;
    if( m_EA                != Value.m_EA )             return false;
    if( m_i8Ori[0]          != Value.m_i8Ori[0] )       return false;
    if( m_i8Ori[1]          != Value.m_i8Ori[1] )       return false;
    if( m_i8Ori[2]          != Value.m_i8Ori[2] )       return false;
    if( m_i8Spd             != Value.m_i8Spd )          return false;
    if( m_i8TrrtAz          != Value.m_i8TrrtAz )       return false;
    if( m_i8GnElv           != Value.m_i8GnElv  )       return false;
    if( m_i8TrrtSlwRt       != Value.m_i8TrrtSlwRt )    return false;
    if( m_i8GnElvRt         != Value.m_i8GnElvRt )      return false;
    return true;
}